

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

WeierstrassPoint * ecc_weierstrass_point_new_identity(WeierstrassCurve *wc)

{
  WeierstrassPoint *pWVar1;
  size_t maxbits;
  mp_int *pmVar2;
  size_t bits;
  WeierstrassPoint *wp;
  WeierstrassCurve *wc_local;
  
  pWVar1 = ecc_weierstrass_point_new_empty(wc);
  maxbits = mp_max_bits(wc->p);
  pmVar2 = mp_new(maxbits);
  pWVar1->X = pmVar2;
  pmVar2 = mp_new(maxbits);
  pWVar1->Y = pmVar2;
  pmVar2 = mp_new(maxbits);
  pWVar1->Z = pmVar2;
  return pWVar1;
}

Assistant:

WeierstrassPoint *ecc_weierstrass_point_new_identity(WeierstrassCurve *wc)
{
    WeierstrassPoint *wp = ecc_weierstrass_point_new_empty(wc);
    size_t bits = mp_max_bits(wc->p);
    wp->X = mp_new(bits);
    wp->Y = mp_new(bits);
    wp->Z = mp_new(bits);
    return wp;
}